

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpWithTcpClient.cpp
# Opt level: O0

void sznet::net::detail::removeKcpConnection(EventLoop *loop,KcpConnectionPtr *conn)

{
  code *local_68;
  undefined8 local_60;
  type local_58;
  Functor local_38;
  KcpConnectionPtr *local_18;
  KcpConnectionPtr *conn_local;
  EventLoop *loop_local;
  
  local_68 = KcpConnection::connectDestroyed;
  local_60 = 0;
  local_18 = conn;
  conn_local = (KcpConnectionPtr *)loop;
  std::bind<void(sznet::net::KcpConnection::*)(),std::shared_ptr<sznet::net::KcpConnection>const&>
            (&local_58,(offset_in_KcpConnection_to_subr *)&local_68,conn);
  std::function<void()>::
  function<std::_Bind<void(sznet::net::KcpConnection::*(std::shared_ptr<sznet::net::KcpConnection>))()>,void>
            ((function<void()> *)&local_38,&local_58);
  EventLoop::queueInLoop(loop,&local_38);
  std::function<void_()>::~function(&local_38);
  std::_Bind<void_(sznet::net::KcpConnection::*(std::shared_ptr<sznet::net::KcpConnection>))()>::
  ~_Bind(&local_58);
  return;
}

Assistant:

void removeKcpConnection(EventLoop* loop, const KcpConnectionPtr& conn)
{
	loop->queueInLoop(std::bind(&KcpConnection::connectDestroyed, conn));
}